

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O1

void mbedtls_ctr_drbg_init(mbedtls_ctr_drbg_context *ctx)

{
  memset(ctx,0,0x158);
  mbedtls_aes_init(&ctx->aes_ctx);
  ctx->reseed_counter = -1;
  ctx->reseed_interval = 10000;
  return;
}

Assistant:

void mbedtls_ctr_drbg_init(mbedtls_ctr_drbg_context *ctx)
{
    memset(ctx, 0, sizeof(mbedtls_ctr_drbg_context));
    mbedtls_aes_init(&ctx->aes_ctx);
    /* Indicate that the entropy nonce length is not set explicitly.
     * See mbedtls_ctr_drbg_set_nonce_len(). */
    ctx->reseed_counter = -1;

    ctx->reseed_interval = MBEDTLS_CTR_DRBG_RESEED_INTERVAL;
}